

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.h
# Opt level: O0

void google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
               (char *data,int size,Operation op,char *field_name)

{
  char *field_name_local;
  Operation op_local;
  int size_local;
  char *data_local;
  
  return;
}

Assistant:

inline void WireFormat::VerifyUTF8StringNamedField(const char* data, int size,
                                                   WireFormat::Operation op,
                                                   const char* field_name) {
#ifdef GOOGLE_PROTOBUF_UTF8_VALIDATION_ENABLED
  WireFormatLite::VerifyUtf8String(
      data, size, static_cast<WireFormatLite::Operation>(op), field_name);
#else
  // Avoid the compiler warning about unused variables.
  (void)data;
  (void)size;
  (void)op;
  (void)field_name;
#endif
}